

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O2

void vkt::compute::anon_unknown_0::EmptyShaderTest::createProgram(SourceCollections *dst)

{
  ProgramSources *this;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [40];
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"comp",&local_79);
  this = ::vk::ProgramCollection<glu::ProgramSources>::add(&dst->glslSources,&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "#version 310 es\nlayout (local_size_x = 1) in;\nvoid main (void) {}\n",&local_7a);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_58,&local_78);
  glu::ProgramSources::operator<<(this,(ShaderSource *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void createProgram (SourceCollections& dst)
{
	dst.glslSources.add("comp") << glu::ComputeSource(
		"#version 310 es\n"
		"layout (local_size_x = 1) in;\n"
		"void main (void) {}\n"
	);
}